

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_0UL>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::SplitBranch<kj::_::Tuple<int,kj::String,kj::Promise<int>>,0ul>,kj::_::PromiseDisposer,kj::Own<kj::_::ForkHubBase,kj::_::ForkHubBase>>
          (PromiseDisposer *this,Own<kj::_::ForkHubBase,_kj::_::ForkHubBase> *params)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  ForkBranchBase::ForkBranchBase((ForkBranchBase *)((long)pvVar1 + 0x3d0),params);
  *(undefined ***)((long)pvVar1 + 0x3d0) = &PTR_destroy_006055e8;
  *(void **)((long)pvVar1 + 0x3d8) = pvVar1;
  *(ForkBranchBase **)this = (ForkBranchBase *)((long)pvVar1 + 0x3d0);
  return (Own<kj::_::SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_0UL>,_kj::_::PromiseDisposer>
          )(SplitBranch<kj::_::Tuple<int,_kj::String,_kj::Promise<int>_>,_0UL> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }